

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

void __thiscall tokenizer::read_number(tokenizer *this)

{
  char *pcVar1;
  int iVar2;
  
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  iVar2 = (int)*this->line_char;
  if (iVar2 - 0x30U < 10) {
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&this->current_word,(char)iVar2);
      pcVar1 = this->line_char;
      this->line_char = pcVar1 + 1;
      this->position_number = this->position_number + 1;
      iVar2 = (int)pcVar1[1];
    } while (iVar2 - 0x30U < 10);
  }
  add_token_to_stream(this,integer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->current_word,0,(this->current_word)._M_string_length,"",0);
  return;
}

Assistant:

void tokenizer::read_number() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isdigit(*line_char)) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    this->add_token_to_stream(Token_Type::integer);

    //position_number += current_word.length();
    current_word = "";
}